

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToParameterName_Test::
~TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToParameterName_Test
          (TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToParameterName_Test
           *this)

{
  TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToParameterName_Test
  *this_local;
  
  ~TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToParameterName_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneUnsignedIntegerParameterAndFailsDueToParameterName)
{
    MockFailureReporterInstaller failureReporterInstaller;

    unsigned int value = 7;
    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", value);
    MockNamedValue parameter("different");
    parameter.setValue(value);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", value);
    mock().actualCall("foo").withParameter("different", value);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}